

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall SQLite::Database::key(Database *this,string *aKey)

{
  runtime_error *this_00;
  Exception exception;
  Exception EStack_28;
  
  if ((int)aKey->_M_string_length < 1) {
    return;
  }
  Exception::Exception
            (&EStack_28,"No encryption support, recompile with SQLITE_HAS_CODEC to enable.");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x18);
  std::runtime_error::runtime_error(this_00,&EStack_28.super_runtime_error);
  *(undefined ***)this_00 = &PTR__runtime_error_001a32e8;
  *(undefined8 *)(this_00 + 0x10) = EStack_28._16_8_;
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Database::key(const std::string& aKey) const
{
    int pass_len = static_cast<int>(aKey.length());
#ifdef SQLITE_HAS_CODEC
    if (pass_len > 0) {
        const int ret = sqlite3_key(mpSQLite, aKey.c_str(), pass_len);
        check(ret);
    }
#else // SQLITE_HAS_CODEC
    if (pass_len > 0) {
        const SQLite::Exception exception("No encryption support, recompile with SQLITE_HAS_CODEC to enable.");
        throw exception;
    }
#endif // SQLITE_HAS_CODEC
}